

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::LowerSetConcatStrMultiItem(Lowerer *this,Instr *instr)

{
  Instr *baseOpnd;
  Func *pFVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  RegOpnd *pRVar7;
  IndirOpnd *dst;
  IntConstOpnd *dst_00;
  IndirOpnd *src;
  void *var;
  JITJavascriptString *pJVar8;
  Instr *pIVar9;
  HelperCallOpnd *this_00;
  byte bVar10;
  Func *func;
  Instr *local_58;
  Instr *onOverflowInsertBeforeInstr;
  Lowerer *local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3a;
  Func *local_38;
  
  func = this->m_func;
  pIVar9 = (Instr *)instr->m_dst;
  local_48 = this;
  OVar3 = IR::Opnd::GetKind((Opnd *)pIVar9);
  if (OVar3 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar4) goto LAB_005bef75;
    *puVar5 = 0;
  }
  baseOpnd = pIVar9->m_next;
  onOverflowInsertBeforeInstr = pIVar9;
  pRVar6 = (RegOpnd *)IR::Instr::UnlinkSrc1(instr);
  OVar3 = IR::Opnd::GetKind((Opnd *)pRVar6);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) goto LAB_005bef75;
    *puVar5 = 0;
  }
  local_3c = ((ValueType *)&baseOpnd->m_noLazyHelperAssert)->field_0;
  bVar4 = ValueType::IsString((ValueType *)&local_3c.field_0);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x661c,"(concatStrOpnd->GetValueType().IsString())",
                       "concatStrOpnd->GetValueType().IsString()");
    if (!bVar4) goto LAB_005bef75;
    *puVar5 = 0;
  }
  local_3a = (pRVar6->super_Opnd).m_valueType.field_0;
  bVar4 = ValueType::IsString((ValueType *)&local_3a.field_0);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x661d,"(srcOpnd->GetValueType().IsString())",
                       "srcOpnd->GetValueType().IsString()");
    if (!bVar4) goto LAB_005bef75;
    *puVar5 = 0;
  }
  pRVar6 = GenerateGetImmutableOrScriptUnreferencedString
                     (local_48,pRVar6,instr,HelperOp_CompoundStringCloneForConcat,false,true);
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_005bef75;
    *puVar5 = 0;
  }
  pFVar1 = instr->m_func;
  if ((pRVar6->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    local_38 = func;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) goto LAB_005bef75;
    *puVar5 = 0;
    func = local_38;
  }
  bVar10 = (pRVar6->super_Opnd).field_0xb;
  pRVar7 = pRVar6;
  if ((bVar10 & 2) != 0) {
    pRVar7 = (RegOpnd *)IR::Opnd::Copy(&pRVar6->super_Opnd,pFVar1);
    bVar10 = (pRVar7->super_Opnd).field_0xb;
  }
  (pRVar7->super_Opnd).field_0xb = bVar10 | 2;
  instr->m_src1 = &pRVar7->super_Opnd;
  dst = IR::IndirOpnd::New((RegOpnd *)baseOpnd,0x18,TyUint32,func,false);
  if ((pRVar6->m_sym->field_0x19 & 4) == 0) {
    dst_00 = (IntConstOpnd *)IR::RegOpnd::New(TyUint32,func);
    src = IR::IndirOpnd::New(pRVar6,0x18,TyUint32,func,false);
    InsertMove((Opnd *)dst_00,&src->super_Opnd,instr,true);
  }
  else {
    var = StackSym::GetConstAddress(pRVar6->m_sym,true);
    pJVar8 = JITJavascriptString::FromVar(var);
    dst_00 = IR::IntConstOpnd::New((ulong)pJVar8->m_charLength,TyUint32,func,false);
  }
  InsertAddWithOverflowCheck
            (false,&dst->super_Opnd,&dst->super_Opnd,&dst_00->super_Opnd,instr,&local_58);
  pIVar9 = IR::Instr::New(Call,func);
  this_00 = IR::HelperCallOpnd::New(HelperOp_OutOfMemoryError,func);
  if (pIVar9->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_005bef75;
    *puVar5 = 0;
  }
  pFVar1 = pIVar9->m_func;
  local_38 = (Func *)instr;
  if ((this_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) {
LAB_005bef75:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  bVar10 = (this_00->super_Opnd).field_0xb;
  if ((bVar10 & 2) != 0) {
    this_00 = (HelperCallOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar1);
    bVar10 = (this_00->super_Opnd).field_0xb;
  }
  pFVar1 = local_38;
  (this_00->super_Opnd).field_0xb = bVar10 | 2;
  pIVar9->m_src1 = &this_00->super_Opnd;
  IR::Instr::InsertBefore((Instr *)local_38,local_58);
  IR::Instr::InsertBefore(local_58,pIVar9);
  LowererMD::LowerCall(&local_48->m_lowererMD,pIVar9,0);
  *(int *)&onOverflowInsertBeforeInstr->m_func =
       *(int *)&onOverflowInsertBeforeInstr->m_func * 8 + 0x30;
  *(undefined1 *)((long)&onOverflowInsertBeforeInstr->bailOutByteCodeLocation + 2) = 0;
  LowererMD::ChangeToWriteBarrierAssign((Instr *)pFVar1,func);
  return;
}

Assistant:

void
Lowerer::LowerSetConcatStrMultiItem(IR::Instr * instr)
{
    Func * func = this->m_func;
    IR::IndirOpnd * dstOpnd = instr->GetDst()->AsIndirOpnd();
    IR::RegOpnd * concatStrOpnd = dstOpnd->GetBaseOpnd();
    IR::RegOpnd * srcOpnd = instr->UnlinkSrc1()->AsRegOpnd();

    Assert(concatStrOpnd->GetValueType().IsString());
    Assert(srcOpnd->GetValueType().IsString());
    srcOpnd = GenerateGetImmutableOrScriptUnreferencedString(srcOpnd, instr, IR::HelperOp_CompoundStringCloneForConcat);
    instr->SetSrc1(srcOpnd);

    IR::IndirOpnd * dstLength = IR::IndirOpnd::New(concatStrOpnd, Js::ConcatStringMulti::GetOffsetOfcharLength(), TyUint32, func);
    IR::Opnd * srcLength;

    if (srcOpnd->m_sym->m_isStrConst)
    {
        srcLength = IR::IntConstOpnd::New(JITJavascriptString::FromVar(srcOpnd->m_sym->GetConstAddress(true))->GetLength(), TyUint32, func);
    }
    else
    {
        srcLength = IR::RegOpnd::New(TyUint32, func);
        InsertMove(srcLength, IR::IndirOpnd::New(srcOpnd, Js::ConcatStringMulti::GetOffsetOfcharLength(), TyUint32, func), instr);
    }

    IR::Instr *onOverflowInsertBeforeInstr;
    InsertAddWithOverflowCheck(false, dstLength, dstLength, srcLength, instr, &onOverflowInsertBeforeInstr);
    IR::Instr* callInstr = IR::Instr::New(Js::OpCode::Call, func);
    callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperOp_OutOfMemoryError, func));

    instr->InsertBefore(onOverflowInsertBeforeInstr);
    onOverflowInsertBeforeInstr->InsertBefore(callInstr);
    this->m_lowererMD.LowerCall(callInstr, 0);
    dstOpnd->SetOffset(dstOpnd->GetOffset() * sizeof(Js::JavascriptString *) + Js::ConcatStringMulti::GetOffsetOfSlots());

    LowererMD::ChangeToWriteBarrierAssign(instr, func);
}